

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabel::setText(QLabel *this,QString *text)

{
  TextFormat TVar1;
  QLabelPrivate *this_00;
  long lVar2;
  Data *pDVar3;
  qsizetype qVar4;
  char cVar5;
  FocusPolicy FVar6;
  QWidgetTextControl *pQVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QStringView QVar9;
  QAnyStringView QVar10;
  QStringView QVar11;
  QString local_50;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  lVar2 = (this_00->text).d.size;
  if ((lVar2 == (text->d).size) &&
     (QVar9.m_data = (this_00->text).d.ptr, QVar9.m_size = lVar2, QVar11.m_data = (text->d).ptr,
     QVar11.m_size = lVar2, cVar5 = QtPrivate::equalStrings(QVar9,QVar11), cVar5 != '\0'))
  goto LAB_0040ebf3;
  pQVar7 = this_00->control;
  this_00->control = (QWidgetTextControl *)0x0;
  QLabelPrivate::clearContents(this_00);
  QString::operator=(&this_00->text,(QString *)text);
  this_00->field_0x340 = this_00->field_0x340 | 0x18;
  TVar1 = this_00->textformat;
  if (TVar1 == AutoText) {
    QVar10.m_size = (this_00->text).d.size | 0x8000000000000000;
    QVar10.field_0.m_data_utf16 = (this_00->text).d.ptr;
    cVar5 = Qt::mightBeRichText(QVar10);
    if (cVar5 == '\0') {
      this_00->effectiveTextFormat = PlainText;
      bVar8 = true;
      goto LAB_0040eacc;
    }
    this_00->effectiveTextFormat = RichText;
    this_00->control = pQVar7;
    if ((this_00->field_0x340 & 0x10) == 0) goto LAB_0040eadd;
LAB_0040eb17:
    QLabelPrivate::ensureTextControl(this_00);
  }
  else {
    this_00->effectiveTextFormat = TVar1;
    bVar8 = TVar1 == PlainText;
LAB_0040eacc:
    this_00->control = pQVar7;
    if ((this_00->field_0x340 & 0x10) != 0) {
      if (((!bVar8) ||
          (((this_00->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
            super_QFlagsStorage<Qt::TextInteractionFlag>.i & 3) != 0)) ||
         (FVar6 = QWidget::focusPolicy
                            (*(QWidget **)
                              &(this_00->super_QFramePrivate).super_QWidgetPrivate.field_0x8),
         FVar6 != NoFocus)) goto LAB_0040eb17;
      pQVar7 = this_00->control;
    }
LAB_0040eadd:
    if (pQVar7 != (QWidgetTextControl *)0x0) {
      (**(code **)(*(long *)pQVar7 + 0x20))(pQVar7);
    }
    this_00->control = (QWidgetTextControl *)0x0;
  }
  if (this_00->effectiveTextFormat != PlainText) {
    QWidget::setAttribute((QWidget *)this,WA_MouseTracking,true);
  }
  pDVar3 = (this_00->buddy).wp.d;
  if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
     ((this_00->buddy).wp.value != (QObject *)0x0)) {
    QLabelPrivate::updateShortcut(this_00);
  }
  QLabelPrivate::updateLabel(this_00);
  QWidget::accessibleName(&local_50,(QWidget *)this);
  qVar4 = local_50.d.size;
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QLabel *)qVar4 == (QLabel *)0x0) {
    local_50.d.d = (Data *)QFont::strikeOut;
    local_50.d.ptr = (char16_t *)0xaaaaaaaa0000800c;
    local_38 = 0xaaaaaaaaffffffff;
    local_50.d.size = (qsizetype)this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
  }
LAB_0040ebf3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabel::setText(const QString &text)
{
    Q_D(QLabel);
    if (d->text == text)
        return;

    QWidgetTextControl *oldControl = d->control;
    d->control = nullptr;

    d->clearContents();
    d->text = text;
    d->isTextLabel = true;
    d->textDirty = true;
    if (d->textformat == Qt::AutoText) {
        if (Qt::mightBeRichText(d->text))
            d->effectiveTextFormat = Qt::RichText;
        else
            d->effectiveTextFormat = Qt::PlainText;
    } else {
        d->effectiveTextFormat = d->textformat;
    }

    d->control = oldControl;

    if (d->needTextControl()) {
        d->ensureTextControl();
    } else {
        delete d->control;
        d->control = nullptr;
    }

    if (d->effectiveTextFormat != Qt::PlainText) {
        setMouseTracking(true);
    } else {
        // Note: mouse tracking not disabled intentionally
    }

#ifndef QT_NO_SHORTCUT
    if (d->buddy)
        d->updateShortcut();
#endif

    d->updateLabel();

#if QT_CONFIG(accessibility)
    if (accessibleName().isEmpty()) {
        QAccessibleEvent event(this, QAccessible::NameChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif
}